

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O3

int mapDeepOcean(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int *piVar8;
  long lVar9;
  int *local_70;
  int *local_60;
  
  iVar1 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar1 == 0) {
    if (0 < h) {
      lVar5 = (long)w;
      local_60 = out + lVar5 * 2 + 5;
      piVar8 = out + lVar5 + 4;
      lVar6 = 0;
      local_70 = out;
      do {
        if (0 < w) {
          lVar9 = 0;
          do {
            iVar1 = piVar8[lVar9 + -1];
            iVar2 = isShallowOcean(iVar1);
            iVar4 = iVar1;
            if (iVar2 != 0) {
              iVar2 = isShallowOcean(local_70[lVar9 + 1]);
              iVar3 = isShallowOcean(piVar8[lVar9]);
              uVar7 = (iVar2 != 0) + 1;
              if (iVar3 == 0) {
                uVar7 = (uint)(iVar2 != 0);
              }
              iVar2 = isShallowOcean(piVar8[lVar9 + -2]);
              iVar3 = isShallowOcean(local_60[lVar9]);
              if (3 < ((uVar7 - (iVar2 == 0)) + 2) - (uint)(iVar3 == 0)) {
                if (iVar1 == 0) {
LAB_00107e4d:
                  iVar4 = 0x18;
                }
                else if (iVar1 == 10) {
                  iVar4 = 0x32;
                }
                else {
                  iVar4 = 0x2f;
                  if (iVar1 != 0x2c) {
                    if (iVar1 == 0x2e) {
                      iVar4 = 0x31;
                    }
                    else {
                      if (iVar1 != 0x2d) goto LAB_00107e4d;
                      iVar4 = 0x30;
                    }
                  }
                }
              }
            }
            out[lVar9] = iVar4;
            lVar9 = lVar9 + 1;
          } while (lVar5 != lVar9);
        }
        lVar6 = lVar6 + 1;
        out = out + lVar5;
        local_60 = local_60 + lVar5 + 2;
        local_70 = local_70 + lVar5 + 2;
        piVar8 = piVar8 + lVar5 + 2;
      } while (lVar6 != h);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mapDeepOcean(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[(i+1) + (j+1)*pW];

            if (isShallowOcean(v11))
            {
                // count adjacent oceans
                int oceans = 0;
                if (isShallowOcean(out[(i+1) + (j+0)*pW])) oceans++;
                if (isShallowOcean(out[(i+2) + (j+1)*pW])) oceans++;
                if (isShallowOcean(out[(i+0) + (j+1)*pW])) oceans++;
                if (isShallowOcean(out[(i+1) + (j+2)*pW])) oceans++;

                if (oceans >= 4)
                {
                    switch (v11)
                    {
                    case warm_ocean:
                        v11 = deep_warm_ocean;
                        break;
                    case lukewarm_ocean:
                        v11 = deep_lukewarm_ocean;
                        break;
                    case ocean:
                        v11 = deep_ocean;
                        break;
                    case cold_ocean:
                        v11 = deep_cold_ocean;
                        break;
                    case frozen_ocean:
                        v11 = deep_frozen_ocean;
                        break;
                    default:
                        v11 = deep_ocean;
                    }
                }
            }

            out[i + j*w] = v11;
        }
    }

    return 0;
}